

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdMakeNan(EpDouble *epd)

{
  EpDouble *epd_local;
  
  epd->type = (EpTypeUnion)(epd->type & 0xffffffff00000000);
  epd->type = (EpTypeUnion)(epd->type & 0xfff80000ffffffff);
  epd->type = (EpTypeUnion)((ulong)epd->type & 0xfff7ffffffffffff | 0x8000000000000);
  epd->type = (EpTypeUnion)((ulong)epd->type & 0x800fffffffffffff | 0x7ff0000000000000);
  epd->type = (EpTypeUnion)((ulong)epd->type & 0x7fffffffffffffff | 0x8000000000000000);
  epd->exponent = 0;
  return;
}

Assistant:

void
EpdMakeNan(EpDouble *epd)
{
  epd->type.nan.mantissa1 = 0;
  epd->type.nan.mantissa0 = 0;
  epd->type.nan.quiet_bit = 1;
  epd->type.nan.exponent = EPD_EXP_INF;
  epd->type.nan.sign = 1;
  epd->exponent = 0;
}